

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O0

void __thiscall OrderGrid::updatePatternRange(OrderGrid *this)

{
  int iVar1;
  int iVar2;
  int totalRows;
  OrderGrid *this_local;
  
  iVar1 = PatternModel::patterns(this->mModel);
  if (iVar1 < this->mVisibleRows) {
    this->mPatternStart = 0;
    this->mPatternEnd = iVar1;
  }
  else {
    iVar2 = PatternModel::cursorPattern(this->mModel);
    this->mPatternStart = iVar2 - this->mVisibleRows / 2;
    this->mPatternEnd = this->mPatternStart + this->mVisibleRows + -1;
    if (this->mPatternStart < 0) {
      this->mPatternEnd = this->mPatternEnd - this->mPatternStart;
      this->mPatternStart = 0;
    }
    if (iVar1 < this->mPatternEnd) {
      this->mPatternStart = this->mPatternStart - (this->mPatternEnd - iVar1);
      this->mPatternEnd = iVar1;
    }
  }
  return;
}

Assistant:

void OrderGrid::updatePatternRange() {
    auto totalRows = mModel.patterns();
    if (mVisibleRows > totalRows) {
        // the entire order can fit in the viewport
        mPatternStart = 0;
        mPatternEnd = totalRows;
    } else {
        // draw as much as we can fit with the cursor in the center
        mPatternStart = mModel.cursorPattern() - (mVisibleRows / 2);
        mPatternEnd = mPatternStart + mVisibleRows - 1;
        if (mPatternStart < 0) {
            mPatternEnd -= mPatternStart;
            mPatternStart = 0;
        }

        if (mPatternEnd > totalRows) {
            mPatternStart -= mPatternEnd - totalRows;
            mPatternEnd = totalRows;
        }

    }
}